

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

uint32_t getFoldedValue(UNewTrie *trie,UChar32 start,int32_t offset)

{
  int iVar1;
  undefined4 in_EAX;
  uint32_t uVar2;
  int iVar3;
  UBool inBlockZero;
  undefined8 uStack_38;
  uint32_t uStack_34;
  
  uStack_38 = CONCAT44(offset,in_EAX);
  iVar1 = start + 0x400;
  while( true ) {
    if (iVar1 <= start) {
      return 0;
    }
    uVar2 = utrie_get32_63(trie,start,&inBlockZero);
    iVar3 = 0x20;
    if ((inBlockZero == '\0') && (iVar3 = 1, uVar2 != 0)) break;
    start = start + iVar3;
  }
  return uStack_34;
}

Assistant:

static uint32_t U_CALLCONV
getFoldedValue(UNewTrie *trie, UChar32 start, int32_t offset) {
    uint32_t value;
    UChar32 limit=0;
    UBool inBlockZero;

    limit=start+0x400;
    while(start<limit) {
        value=utrie_get32(trie, start, &inBlockZero);
        if(inBlockZero) {
            start+=UTRIE_DATA_BLOCK_LENGTH;
        } else if(value!=0) {
            return (uint32_t)offset;
        } else {
            ++start;
        }
    }
    return 0;

}